

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int gz_decomp(gz_statep state)

{
  uInt uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *msg;
  uint uVar5;
  
  uVar1 = (state->strm).avail_out;
  iVar4 = 0;
LAB_00106d62:
  if (((state->strm).avail_in == 0) && (iVar3 = gz_avail(state), iVar3 == -1)) {
    return -1;
  }
  if ((state->strm).avail_in != 0) {
    iVar4 = inflate(&state->strm,0);
    switch(iVar4) {
    case -4:
      msg = "out of memory";
      iVar4 = -4;
      break;
    case -3:
      pcVar2 = (state->strm).msg;
      msg = "compressed data error";
      if (pcVar2 != (char *)0x0) {
        msg = pcVar2;
      }
      iVar4 = -3;
      break;
    case -2:
    case 2:
      msg = "internal error: inflate stream corrupt";
      iVar4 = -2;
      break;
    default:
      goto switchD_00106da3_caseD_ffffffff;
    }
    gz_error(state,iVar4,msg);
    return -1;
  }
  gz_error(state,-5,"unexpected end of file");
LAB_00106ddb:
  uVar5 = uVar1 - (state->strm).avail_out;
  (state->x).have = uVar5;
  (state->x).next = (state->strm).next_out + -(ulong)uVar5;
  if (iVar4 == 1) {
    state->how = 0;
  }
  return 0;
switchD_00106da3_caseD_ffffffff:
  if ((iVar4 == 1) || ((state->strm).avail_out == 0)) goto LAB_00106ddb;
  goto LAB_00106d62;
}

Assistant:

local int gz_decomp(state)
    gz_statep state;
{
    int ret = Z_OK;
    unsigned had;
    z_streamp strm = &(state->strm);

    /* fill output buffer up to end of deflate stream */
    had = strm->avail_out;
    do {
        /* get more input for inflate() */
        if (strm->avail_in == 0 && gz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0) {
            gz_error(state, Z_BUF_ERROR, "unexpected end of file");
            break;
        }

        /* decompress and handle errors */
        ret = inflate(strm, Z_NO_FLUSH);
        if (ret == Z_STREAM_ERROR || ret == Z_NEED_DICT) {
            gz_error(state, Z_STREAM_ERROR,
                     "internal error: inflate stream corrupt");
            return -1;
        }
        if (ret == Z_MEM_ERROR) {
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        if (ret == Z_DATA_ERROR) {              /* deflate stream invalid */
            gz_error(state, Z_DATA_ERROR,
                     strm->msg == NULL ? "compressed data error" : strm->msg);
            return -1;
        }
    } while (strm->avail_out && ret != Z_STREAM_END);

    /* update available output */
    state->x.have = had - strm->avail_out;
    state->x.next = strm->next_out - state->x.have;

    /* if the gzip stream completed successfully, look for another */
    if (ret == Z_STREAM_END)
        state->how = LOOK;

    /* good decompression */
    return 0;
}